

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_addrinfo.c
# Opt level: O0

void Curl_freeaddrinfo(Curl_addrinfo *cahead)

{
  Curl_addrinfo *pCVar1;
  Curl_addrinfo *local_20;
  Curl_addrinfo *ca;
  Curl_addrinfo *canext;
  Curl_addrinfo *cahead_local;
  
  local_20 = cahead;
  while (local_20 != (Curl_addrinfo *)0x0) {
    if (local_20->ai_addr != (sockaddr *)0x0) {
      (*Curl_cfree)(local_20->ai_addr);
    }
    if (local_20->ai_canonname != (char *)0x0) {
      (*Curl_cfree)(local_20->ai_canonname);
    }
    pCVar1 = local_20->ai_next;
    (*Curl_cfree)(local_20);
    local_20 = pCVar1;
  }
  return;
}

Assistant:

void
Curl_freeaddrinfo(Curl_addrinfo *cahead)
{
  Curl_addrinfo *vqualifier canext;
  Curl_addrinfo *ca;

  for(ca = cahead; ca != NULL; ca = canext) {

    if(ca->ai_addr)
      free(ca->ai_addr);

    if(ca->ai_canonname)
      free(ca->ai_canonname);

    canext = ca->ai_next;

    free(ca);
  }
}